

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseDenseProduct.h
# Opt level: O0

void Eigen::internal::
     sparse_time_dense_product_impl<Eigen::SparseMatrix<double,_0,_int>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_double,_0,_true>
     ::run(SparseMatrix<double,_0,_int> *lhs,Matrix<double,__1,_1,_0,__1,_1> *rhs,
          Matrix<double,__1,_1,_0,__1,_1> *res,double *alpha)

{
  double dVar1;
  bool bVar2;
  Index IVar3;
  Scalar *pSVar4;
  SparseMatrix<double,_0,_int> *mat;
  Scalar *pSVar5;
  char *pcVar6;
  int __c;
  undefined1 local_88 [8];
  LhsInnerIterator it;
  ReturnType rhs_j;
  long local_48;
  Index j;
  Index c;
  LhsEval lhsEval;
  double *alpha_local;
  Matrix<double,__1,_1,_0,__1,_1> *res_local;
  Matrix<double,__1,_1,_0,__1,_1> *rhs_local;
  SparseMatrix<double,_0,_int> *lhs_local;
  
  lhsEval.super_evaluator<Eigen::SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>_>.m_zero
       = (Scalar)alpha;
  evaluator<Eigen::SparseMatrix<double,_0,_int>_>::evaluator
            ((evaluator<Eigen::SparseMatrix<double,_0,_int>_> *)&c,lhs);
  j = 0;
  while( true ) {
    IVar3 = PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::cols
                      (&rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>);
    if (IVar3 <= j) break;
    local_48 = 0;
    while( true ) {
      IVar3 = SparseMatrix<double,_0,_int>::outerSize(lhs);
      if (IVar3 <= local_48) break;
      dVar1 = *(double *)
               lhsEval.
               super_evaluator<Eigen::SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>_>.
               m_zero;
      pSVar4 = PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::coeff
                         (&rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                          local_48,j);
      it.m_end = (Index)(dVar1 * *pSVar4);
      mat = internal::evaluator::operator_cast_to_SparseMatrix_((evaluator *)&c);
      SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>::InnerIterator::InnerIterator
                ((InnerIterator *)local_88,
                 &mat->super_SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>,local_48);
      while( true ) {
        bVar2 = SparseCompressedBase::InnerIterator::operator_cast_to_bool
                          ((InnerIterator *)local_88);
        if (!bVar2) break;
        pSVar5 = SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>::InnerIterator::value
                           ((InnerIterator *)local_88);
        IVar3 = it.m_end;
        dVar1 = *pSVar5;
        pcVar6 = SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>::InnerIterator::index
                           ((InnerIterator *)local_88,(char *)mat,__c);
        mat = (SparseMatrix<double,_0,_int> *)(long)(int)pcVar6;
        pSVar4 = PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::coeffRef
                           (&res->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                            (Index)mat,j);
        *pSVar4 = dVar1 * (double)IVar3 + *pSVar4;
        SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>::InnerIterator::operator++
                  ((InnerIterator *)local_88);
      }
      local_48 = local_48 + 1;
    }
    j = j + 1;
  }
  evaluator<Eigen::SparseMatrix<double,_0,_int>_>::~evaluator
            ((evaluator<Eigen::SparseMatrix<double,_0,_int>_> *)&c);
  return;
}

Assistant:

static void run(const SparseLhsType& lhs, const DenseRhsType& rhs, DenseResType& res, const AlphaType& alpha)
  {
    LhsEval lhsEval(lhs);
    for(Index c=0; c<rhs.cols(); ++c)
    {
      for(Index j=0; j<lhs.outerSize(); ++j)
      {
//        typename Res::Scalar rhs_j = alpha * rhs.coeff(j,c);
        typename ScalarBinaryOpTraits<AlphaType, typename Rhs::Scalar>::ReturnType rhs_j(alpha * rhs.coeff(j,c));
        for(LhsInnerIterator it(lhsEval,j); it ;++it)
          res.coeffRef(it.index(),c) += it.value() * rhs_j;
      }
    }
  }